

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ylib_submodules(lyd_node *parent,lysp_module *pmod,ly_bool bis)

{
  lysp_include *plVar1;
  long lVar2;
  LY_ERR LVar3;
  int iVar4;
  char *pcVar5;
  ulong uVar6;
  undefined7 in_register_00000011;
  LY_ERR ret__;
  long lVar7;
  ulong uVar8;
  lyd_node *cont;
  char *str;
  lyd_node *local_50;
  lyd_node *local_48;
  char *local_40;
  char *local_38;
  
  local_38 = "ly_log_location";
  if ((int)CONCAT71(in_register_00000011,bis) == 0) {
    local_38 = "shared-schema";
  }
  local_38 = local_38 + 7;
  lVar7 = 0;
  uVar8 = 0;
  local_48 = parent;
  do {
    plVar1 = pmod->includes;
    if (plVar1 == (lysp_include *)0x0) {
      uVar6 = 0;
    }
    else {
      uVar6 = *(ulong *)(plVar1[-1].rev + 8);
    }
    if (uVar6 <= uVar8) {
      return LY_SUCCESS;
    }
    lVar2 = *(long *)(plVar1->rev + lVar7 + -0x28);
    if (bis == '\0') {
      pcVar5 = *(char **)(lVar2 + 8);
      if (pcVar5 == (char *)0x0) {
        pcVar5 = "";
      }
      LVar3 = lyd_new_list(local_48,(lys_module *)0x0,"submodule",0,&local_50,
                           *(undefined8 *)(lVar2 + 0x80),pcVar5);
LAB_0011d7d0:
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    else {
      LVar3 = lyd_new_list(local_48,(lys_module *)0x0,"submodule",0,&local_50);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
      if (*(char **)(lVar2 + 8) != (char *)0x0) {
        LVar3 = lyd_new_term(local_50,(lys_module *)0x0,"revision",*(char **)(lVar2 + 8),0,
                             (lyd_node **)0x0);
        goto LAB_0011d7d0;
      }
    }
    if (*(long *)(lVar2 + 0x88) != 0) {
      iVar4 = asprintf(&local_40,"file://%s");
      if (iVar4 == -1) {
        ly_log(pmod->mod->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","ylib_submodules")
        ;
        return LY_EMEM;
      }
      LVar3 = lyd_new_term(local_50,(lys_module *)0x0,local_38,local_40,0,(lyd_node **)0x0);
      free(local_40);
      if (LVar3 != LY_SUCCESS) {
        return LVar3;
      }
    }
    uVar8 = uVar8 + 1;
    lVar7 = lVar7 + 0x38;
  } while( true );
}

Assistant:

static LY_ERR
ylib_submodules(struct lyd_node *parent, const struct lysp_module *pmod, ly_bool bis)
{
    LY_ERR ret;
    LY_ARRAY_COUNT_TYPE i;
    struct lyd_node *cont;
    struct lysp_submodule *submod;
    int r;
    char *str;

    LY_ARRAY_FOR(pmod->includes, i) {
        submod = pmod->includes[i].submodule;

        if (bis) {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "submodule", 0, &cont, submod->name));

            if (submod->revs) {
                LY_CHECK_RET(lyd_new_term(cont, NULL, "revision", submod->revs[0].date, 0, NULL));
            }
        } else {
            LY_CHECK_RET(lyd_new_list(parent, NULL, "submodule", 0, &cont, submod->name,
                    (submod->revs ? submod->revs[0].date : "")));
        }

        if (submod->filepath) {
            r = asprintf(&str, "file://%s", submod->filepath);
            LY_CHECK_ERR_RET(r == -1, LOGMEM(pmod->mod->ctx), LY_EMEM);

            ret = lyd_new_term(cont, NULL, bis ? "location" : "schema", str, 0, NULL);
            free(str);
            LY_CHECK_RET(ret);
        }
    }

    return LY_SUCCESS;
}